

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

void __thiscall Helper::GenerateShuffleVectors(Helper *this,int n_p,int n_d,int count)

{
  pointer pbVar1;
  int iVar2;
  int iVar3;
  time_t tVar4;
  ostream *poVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  pointer pbVar9;
  int j;
  int iVar10;
  bool bVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string local_378 [8];
  ofstream output_file;
  time_t t;
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_name;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator_type local_31;
  
  std::ofstream::ofstream(local_378);
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffe88,"../randoms/alice/U_PA.txt",&local_39);
  std::__cxx11::string::string(local_158,"../randoms/bob/U_PB.txt",&local_38);
  std::__cxx11::string::string(local_138,"../randoms/alice/R_PA.txt",&local_37);
  std::__cxx11::string::string(local_118,"../randoms/bob/R_PB.txt",&local_36);
  std::__cxx11::string::string(local_f8,"../randoms/alice/U_DA.txt",&local_35);
  std::__cxx11::string::string(local_d8,"../randoms/bob/U_DB.txt",&local_34);
  std::__cxx11::string::string(local_b8,"../randoms/alice/R_DA.txt",&local_33);
  std::__cxx11::string::string(local_98,"../randoms/bob/R_DB.txt",&local_32);
  __l._M_len = 8;
  __l._M_array = (iterator)&stack0xfffffffffffffe88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78,__l,&local_31);
  lVar7 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)(&stack0xfffffffffffffe88 + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  tVar4 = time((time_t *)&stack0xfffffffffffffe88);
  srand((uint)tVar4);
  pbVar9 = (pointer)0x0;
  while (pbVar9 != (pointer)0x8) {
    std::ofstream::open(local_378,(int)((long)pbVar9 << 5) + local_78._0_4_);
    iVar6 = n_d;
    if (pbVar9 < (pointer)0x4) {
      iVar6 = n_p;
    }
    iVar2 = count;
    file_name.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar9;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    while (pbVar1 = file_name.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage, iVar2 != 0) {
      for (iVar10 = 0; iVar8 = (uint)(pbVar9 < (pointer)0x4) * 3 + 2, iVar10 != iVar6;
          iVar10 = iVar10 + 1) {
        while (bVar11 = iVar8 != 0, iVar8 = iVar8 + -1, bVar11) {
          iVar3 = rand();
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_378,iVar3 % 10000);
          std::operator<<(poVar5," ");
        }
        std::endl<char,std::char_traits<char>>((ostream *)local_378);
      }
      std::endl<char,std::char_traits<char>>((ostream *)local_378);
      iVar2 = iVar2 + -1;
    }
    std::ostream::flush();
    std::ofstream::close();
    pbVar9 = (pointer)((long)&(pbVar1->_M_dataplus)._M_p + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  std::ofstream::~ofstream(local_378);
  return;
}

Assistant:

void Helper::GenerateShuffleVectors(int n_p, int n_d, int count)
{
    std::ofstream output_file;
    std::vector<std::string> file_name = {"../randoms/alice/U_PA.txt", "../randoms/bob/U_PB.txt", "../randoms/alice/R_PA.txt", "../randoms/bob/R_PB.txt",
                                          "../randoms/alice/U_DA.txt", "../randoms/bob/U_DB.txt", "../randoms/alice/R_DA.txt", "../randoms/bob/R_DB.txt"};
    time_t t;
    srand((unsigned)time(&t));

    for (int i = 0; i < 8; i++)
    {
        output_file.open(file_name[i]);
        int n = (i < 4 ? n_p : n_d);
        int m = (i < 4 ? 5 : 2);
        int l = count;
        while (l--)
        {
            for (int j = 0; j < n; j++)
            {
                for (int k = 0; k < m; k++)
                    output_file << rand() %10000 << " ";
                output_file << std::endl;
            }
            output_file << std::endl;
        }
        output_file.flush();
        output_file.close();
    }
}